

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_935bd6::HandleArchiveExtractCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  Status SVar5;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  string_view name_03;
  static_string_view name_04;
  cmWorkingDirectory workdir;
  string destDir;
  string local_1b8;
  string inFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  cmAlphaNum local_158;
  Arguments parsedArgs;
  Instance local_88;
  
  if ((anonymous_namespace)::
      HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar3 != 0) {
      parsedArgs.Destination._M_string_length = 0;
      parsedArgs.Destination.field_2._M_allocated_capacity = 0;
      parsedArgs.Verbose = false;
      parsedArgs.ListOnly = false;
      parsedArgs._82_6_ = 0;
      parsedArgs.Destination._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Input.field_2._M_allocated_capacity = 0;
      parsedArgs.Input.field_2._8_8_ = 0;
      parsedArgs.Input._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Input._M_string_length = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      name.super_string_view._M_str = "INPUT";
      name.super_string_view._M_len = 5;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name,0x30);
      name_00.super_string_view._M_str = "VERBOSE";
      name_00.super_string_view._M_len = 7;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)&parsedArgs,name_00,0x50);
      name_01.super_string_view._M_str = "LIST_ONLY";
      name_01.super_string_view._M_len = 9;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)&parsedArgs,name_01,0x51);
      name_02.super_string_view._M_str = "DESTINATION";
      name_02.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_02,0x58);
      local_88.ParseResults = (ParseResult *)0x0;
      local_88.Bindings = (ActionMap *)0x78;
      local_88.Result =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_invoke;
      local_88.UnparsedArguments =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::
              _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
              ::_M_manager;
      name_03._M_str = "PATTERNS";
      name_03._M_len = 8;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_03,(KeywordAction *)&local_88);
      std::_Function_base::~_Function_base((_Function_base *)&local_88);
      name_04.super_string_view._M_str = "TOUCH";
      name_04.super_string_view._M_len = 5;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)&parsedArgs,name_04,0x90);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleArchiveExtractCommand::parser,(ActionMap *)&parsedArgs);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parsedArgs);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveExtractCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleArchiveExtractCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  local_88.UnparsedArguments = &unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.View_._M_str =
       (char *)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  local_158.View_._M_len =
       (size_t)((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.Input._M_dataplus._M_p = (pointer)&parsedArgs.Input.field_2;
  parsedArgs.Input._M_string_length = 0;
  parsedArgs.Input.field_2._M_allocated_capacity =
       parsedArgs.Input.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs._80_8_ = parsedArgs._80_8_ & 0xffffffffffff0000;
  parsedArgs.Destination._M_dataplus._M_p = (pointer)&parsedArgs.Destination.field_2;
  parsedArgs.Destination._M_string_length = 0;
  parsedArgs.Destination.field_2._M_allocated_capacity =
       parsedArgs.Destination.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  parsedArgs.Patterns.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  parsedArgs._137_8_ = 0;
  local_88.Bindings = (ActionMap *)&HandleArchiveExtractCommand::parser;
  local_88.ParseResults = &parsedArgs.super_ParseResult;
  local_88.Keyword._M_len = 0;
  local_88.Keyword._M_str = (char *)0x0;
  local_88.KeywordValuesSeen = 0;
  local_88.KeywordValuesExpected = 0;
  local_88.KeywordValueFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_88.KeywordValueFunc.super__Function_base._M_functor._8_8_ = 0;
  local_88.KeywordValueFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  local_88.KeywordValueFunc._M_invoker = (_Invoker_type)0x0;
  local_88.DoneWithPositional = false;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  local_88.Result = local_88.ParseResults;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_88,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_158,0);
  std::_Function_base::~_Function_base(&local_88.KeywordValueFunc.super__Function_base);
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88.Bindings = (ActionMap *)&DAT_00000018;
    local_88.ParseResults = (ParseResult *)0x5d2be1;
    local_158.View_._M_str =
         ((unrecognizedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_158.View_._M_len =
         (unrecognizedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    cmStrCat<char[2]>(&workdir.OldDir,(cmAlphaNum *)&local_88,&local_158,(char (*) [2])0x5eaac5);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&workdir);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar1 = false;
    goto LAB_002820b1;
  }
  bVar1 = ArgumentParser::ParseResult::MaybeReportError
                    (&parsedArgs.super_ParseResult,status->Makefile);
  if (bVar1) {
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar1 = true;
    goto LAB_002820b1;
  }
  std::__cxx11::string::string((string *)&inFile,(string *)&parsedArgs.Input);
  if (parsedArgs.ListOnly == true) {
    bVar2 = cmSystemTools::ListTar
                      (&inFile,&parsedArgs.Patterns.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,parsedArgs.Verbose);
    bVar1 = true;
    if (!bVar2) {
      local_88.Bindings = (ActionMap *)&DAT_00000010;
      local_88.ParseResults = (ParseResult *)0x5d2db2;
      local_158.View_._M_len = inFile._M_string_length;
      local_158.View_._M_str = inFile._M_dataplus._M_p;
      cmStrCat<>(&workdir.OldDir,(cmAlphaNum *)&local_88,&local_158);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&workdir);
      cmSystemTools::s_FatalErrorOccurred = true;
      goto LAB_002820a5;
    }
  }
  else {
    psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(status->Makefile);
    std::__cxx11::string::string((string *)&destDir,(string *)psVar4);
    if (parsedArgs.Destination._M_string_length == 0) {
LAB_00281f8c:
      cmWorkingDirectory::cmWorkingDirectory(&workdir,&destDir);
      if (workdir.ResultCode == 0) {
        bVar1 = cmSystemTools::ExtractTar
                          (&inFile,&parsedArgs.Patterns.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ,(uint)parsedArgs.Touch,parsedArgs.Verbose);
        if (bVar1) {
          cmWorkingDirectory::~cmWorkingDirectory(&workdir);
          std::__cxx11::string::~string((string *)&destDir);
          bVar1 = true;
          goto LAB_002820a7;
        }
        local_88.Bindings = (ActionMap *)&DAT_00000013;
        local_88.ParseResults = (ParseResult *)0x5d2e08;
        local_158.View_._M_len = inFile._M_string_length;
        local_158.View_._M_str = inFile._M_dataplus._M_p;
        cmStrCat<>(&local_1b8,(cmAlphaNum *)&local_88,&local_158);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        local_88.Bindings = (ActionMap *)0x27;
        local_88.ParseResults = (ParseResult *)0x5d2de0;
        local_158.View_._M_len = destDir._M_string_length;
        local_158.View_._M_str = destDir._M_dataplus._M_p;
        cmStrCat<>(&local_1b8,(cmAlphaNum *)&local_88,&local_158);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      std::__cxx11::string::~string((string *)&local_1b8);
      cmSystemTools::s_FatalErrorOccurred = true;
      cmWorkingDirectory::~cmWorkingDirectory(&workdir);
    }
    else {
      bVar1 = cmsys::SystemTools::FileIsFullPath(&parsedArgs.Destination);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&destDir);
      }
      else {
        local_88.Bindings = (ActionMap *)destDir._M_string_length;
        local_88.ParseResults = (ParseResult *)destDir._M_dataplus._M_p;
        local_158.View_._M_len = 1;
        local_158.View_._M_str = "/";
        cmStrCat<std::__cxx11::string>
                  (&workdir.OldDir,(cmAlphaNum *)&local_88,&local_158,&parsedArgs.Destination);
        std::__cxx11::string::operator=((string *)&destDir,(string *)&workdir);
        std::__cxx11::string::~string((string *)&workdir);
      }
      SVar5 = cmsys::SystemTools::MakeDirectory(&destDir,(mode_t *)0x0);
      if (SVar5.Kind_ == Success) {
        bVar1 = cmsys::SystemTools::FileIsFullPath(&inFile);
        if (!bVar1) {
          cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
          local_88.Bindings = (ActionMap *)local_1b8._M_string_length;
          local_88.ParseResults = (ParseResult *)local_1b8._M_dataplus._M_p;
          local_158.View_._M_len = 1;
          local_158.View_._M_str = "/";
          cmStrCat<std::__cxx11::string>(&workdir.OldDir,(cmAlphaNum *)&local_88,&local_158,&inFile)
          ;
          std::__cxx11::string::operator=((string *)&inFile,(string *)&workdir);
          std::__cxx11::string::~string((string *)&workdir);
          std::__cxx11::string::~string((string *)&local_1b8);
        }
        goto LAB_00281f8c;
      }
      local_88.Bindings = (ActionMap *)0x1c;
      local_88.ParseResults = (ParseResult *)0x5d2dc3;
      local_158.View_._M_len = destDir._M_string_length;
      local_158.View_._M_str = destDir._M_dataplus._M_p;
      cmStrCat<>(&workdir.OldDir,(cmAlphaNum *)&local_88,&local_158);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&workdir);
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    std::__cxx11::string::~string((string *)&destDir);
LAB_002820a5:
    bVar1 = false;
  }
LAB_002820a7:
  std::__cxx11::string::~string((string *)&inFile);
LAB_002820b1:
  HandleArchiveExtractCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar1;
}

Assistant:

bool HandleArchiveExtractCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Input;
    bool Verbose = false;
    bool ListOnly = false;
    std::string Destination;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Patterns;
    bool Touch = false;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("INPUT"_s, &Arguments::Input)
                               .Bind("VERBOSE"_s, &Arguments::Verbose)
                               .Bind("LIST_ONLY"_s, &Arguments::ListOnly)
                               .Bind("DESTINATION"_s, &Arguments::Destination)
                               .Bind("PATTERNS"_s, &Arguments::Patterns)
                               .Bind("TOUCH"_s, &Arguments::Touch);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  std::string inFile = parsedArgs.Input;

  if (parsedArgs.ListOnly) {
    if (!cmSystemTools::ListTar(inFile, parsedArgs.Patterns,
                                parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to list: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    std::string destDir = status.GetMakefile().GetCurrentBinaryDirectory();
    if (!parsedArgs.Destination.empty()) {
      if (cmSystemTools::FileIsFullPath(parsedArgs.Destination)) {
        destDir = parsedArgs.Destination;
      } else {
        destDir = cmStrCat(destDir, "/", parsedArgs.Destination);
      }

      if (!cmSystemTools::MakeDirectory(destDir)) {
        status.SetError(cmStrCat("failed to create directory: ", destDir));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      if (!cmSystemTools::FileIsFullPath(inFile)) {
        inFile =
          cmStrCat(cmSystemTools::GetCurrentWorkingDirectory(), "/", inFile);
      }
    }

    cmWorkingDirectory workdir(destDir);
    if (workdir.Failed()) {
      status.SetError(
        cmStrCat("failed to change working directory to: ", destDir));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }

    if (!cmSystemTools::ExtractTar(
          inFile, parsedArgs.Patterns,
          parsedArgs.Touch ? cmSystemTools::cmTarExtractTimestamps::No
                           : cmSystemTools::cmTarExtractTimestamps::Yes,
          parsedArgs.Verbose)) {
      status.SetError(cmStrCat("failed to extract: ", inFile));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  return true;
}